

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_entity_sets.cc
# Opt level: O3

CodimMeshDataSet<unsigned_int> *
lf::mesh::utils::CountNumSuperEntities
          (CodimMeshDataSet<unsigned_int> *__return_storage_ptr__,
          shared_ptr<const_lf::mesh::Mesh> *mesh_p,dim_t codim_sub,dim_t codim_super)

{
  element_type *peVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  uint *puVar5;
  runtime_error *prVar6;
  long extraout_RDX;
  long lVar7;
  undefined1 auVar8 [16];
  stringstream ss;
  string local_230;
  string local_210;
  string local_1f0;
  shared_ptr<const_lf::mesh::Mesh> local_1d0;
  undefined8 *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  undefined8 *puVar4;
  
  uVar2 = (**((mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
             ->_vptr_Mesh)();
  if (uVar2 < codim_sub) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Illegal codim_sub = ",0x14);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,"(mesh_p->DimMesh() >= codim_sub)","");
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/special_entity_sets.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_210,&local_230,0x16,&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"this code should not be reached");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (codim_super <= codim_sub) {
    local_1d0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_1d0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
    if (local_1d0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1d0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1d0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1d0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_1d0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    CodimMeshDataSet<unsigned_int>::CodimMeshDataSet(__return_storage_ptr__,&local_1d0,codim_sub,0);
    if (local_1d0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1d0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    peVar1 = (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar3 = (*peVar1->_vptr_Mesh[2])(peVar1,(ulong)(codim_sub - codim_super));
    puVar4 = (undefined8 *)CONCAT44(extraout_var,iVar3);
    if (extraout_RDX != 0) {
      local_1c0 = puVar4 + extraout_RDX;
      do {
        auVar8 = (**(code **)(*(long *)*puVar4 + 8))((long *)*puVar4,codim_super);
        if (auVar8._8_8_ != 0) {
          lVar7 = 0;
          do {
            puVar5 = CodimMeshDataSet<unsigned_int>::operator()
                               (__return_storage_ptr__,*(Entity **)(auVar8._0_8_ + lVar7));
            *puVar5 = *puVar5 + 1;
            lVar7 = lVar7 + 8;
          } while (auVar8._8_8_ << 3 != lVar7);
        }
        puVar4 = puVar4 + 1;
      } while (puVar4 != local_1c0);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Codim_super to large",0x14);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,"codim_super <= codim_sub","");
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/special_entity_sets.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_210,&local_230,0x17,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar6,"this code should not be reached");
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CodimMeshDataSet<lf::base::size_type> CountNumSuperEntities(
    const std::shared_ptr<const Mesh>& mesh_p, lf::base::dim_t codim_sub,
    lf::base::dim_t codim_super) {
  LF_VERIFY_MSG((mesh_p->DimMesh() >= codim_sub),
                "Illegal codim_sub = " << codim_sub);
  LF_VERIFY_MSG(codim_super <= codim_sub, "Codim_super to large");

  // Declare and initialize the data set
  CodimMeshDataSet<lf::base::size_type> sup_ent_cnt{mesh_p, codim_sub, 0};

  const lf::base::dim_t super_codim = codim_sub - codim_super;
  // Run through all super entities
  for (const lf::mesh::Entity* e : mesh_p->Entities(super_codim)) {
    // Traverse all sub-entities of a specific relative co-dimension
    for (const lf::mesh::Entity* subent : e->SubEntities(codim_super)) {
      // Write access to an entry in the data set
      sup_ent_cnt(*subent) += 1;
    }
  }
  return sup_ent_cnt;
}